

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcEquipmentElement::IfcEquipmentElement(IfcEquipmentElement *this)

{
  *(undefined ***)&(this->super_IfcElement).field_0x148 = &PTR__Object_007331c0;
  *(undefined8 *)&this->field_0x150 = 0;
  *(char **)&this->field_0x158 = "IfcEquipmentElement";
  IfcElement::IfcElement(&this->super_IfcElement,&PTR_construction_vtable_24__00757320);
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject = 0x757218;
  *(undefined8 *)&(this->super_IfcElement).field_0x148 = 0x757308;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x88 = 0x757240;
  (this->super_IfcElement).super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x757268;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0xd0 = 0x757290;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.field_0x100 = 0x7572b8;
  *(undefined8 *)&(this->super_IfcElement).field_0x138 = 0x7572e0;
  return;
}

Assistant:

IfcEquipmentElement() : Object("IfcEquipmentElement") {}